

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::eliminateUselessSymbols(CFG *this)

{
  ostream *poVar1;
  CFG *this_local;
  
  eliminateNonGeneratingSymbols(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated non-generating symbols: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printReadable(this);
  eliminateNonReachableSymbols(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated non-reachable symbols: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printReadable(this);
  return;
}

Assistant:

void CFG::eliminateUselessSymbols() {
    eliminateNonGeneratingSymbols();

    std::cout << "Eliminated non-generating symbols: " << std::endl;
    printReadable();

    eliminateNonReachableSymbols();

    std::cout << "Eliminated non-reachable symbols: " << std::endl;
    printReadable();
}